

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muxread.c
# Opt level: O2

WebPMux * WebPMuxCreateInternal(WebPData *bitstream,int copy_data,int version)

{
  ulong riff_size;
  WebPChunk **chunk_list;
  uint32_t uVar1;
  int *piVar2;
  WebPMuxError WVar3;
  uint uVar4;
  WebPChunkId WVar5;
  int iVar6;
  WebPMux *mux;
  WebPMuxImage *wpi;
  uint8_t *puVar7;
  ulong uVar8;
  WebPChunk **ppWVar9;
  int iVar10;
  int *data;
  long lVar11;
  uint8_t *puVar12;
  WebPChunk **chunk_list_00;
  ulong uVar13;
  WebPChunk ***chunk_list_01;
  size_t local_100;
  WebPChunk chunk;
  WebPChunk subchunk;
  WebPChunk **unknown_chunk_list;
  WebPData local_98;
  WebPChunk **chunk_list_ends [11];
  
  chunk_list_ends[8] = (WebPChunk **)0x0;
  chunk_list_ends[9] = (WebPChunk **)0x0;
  chunk_list_ends[6] = (WebPChunk **)0x0;
  chunk_list_ends[7] = (WebPChunk **)0x0;
  chunk_list_ends[4] = (WebPChunk **)0x0;
  chunk_list_ends[5] = (WebPChunk **)0x0;
  chunk_list_ends[2] = (WebPChunk **)0x0;
  chunk_list_ends[3] = (WebPChunk **)0x0;
  chunk_list_ends[0] = (WebPChunk **)0x0;
  chunk_list_ends[1] = (WebPChunk **)0x0;
  chunk_list_ends[10] = (WebPChunk **)0x0;
  ChunkInit(&chunk);
  if (bitstream == (WebPData *)0x0 || (version & 0xffffff00U) != 0x100) {
    return (WebPMux *)0x0;
  }
  piVar2 = (int *)bitstream->bytes;
  uVar13 = bitstream->size;
  if (uVar13 < 0x14 || piVar2 == (int *)0x0) {
    return (WebPMux *)0x0;
  }
  if (*piVar2 != 0x46464952) {
    return (WebPMux *)0x0;
  }
  if (piVar2[2] != 0x50424557) {
    return (WebPMux *)0x0;
  }
  mux = WebPNewInternal(0x109);
  if (mux == (WebPMux *)0x0) {
    return (WebPMux *)0x0;
  }
  uVar1 = piVar2[3];
  if ((((uVar1 == 0x20385056) || (uVar1 == 0x4c385056)) || (uVar1 == 0x58385056)) &&
     (uVar4 = piVar2[1], uVar4 < 0xfffffff7)) {
    uVar8 = (ulong)(uVar4 + 1 & 0xfffffffe);
    riff_size = uVar8 + 8;
    if ((riff_size <= uVar13 && 2 < uVar4) &&
       (wpi = (WebPMuxImage *)WebPSafeMalloc(1,0x38), wpi != (WebPMuxImage *)0x0)) {
      local_100 = uVar8 - 4;
      MuxImageInit(wpi);
      chunk_list = &wpi->img;
      chunk_list_00 = &wpi->alpha;
      for (data = piVar2 + 3; data != (int *)((long)piVar2 + riff_size);
          data = (int *)((long)data + lVar11)) {
        WVar3 = ChunkVerifyAndAssign(&chunk,(uint8_t *)data,local_100,riff_size,copy_data);
        if (WVar3 != WEBP_MUX_OK) goto LAB_00140fbe;
        uVar4 = (int)chunk.data.size + 1U & 0xfffffffe;
        WVar5 = ChunkGetIdFromTag(chunk.tag);
        puVar12 = chunk.data.bytes;
        if (WVar5 == WEBP_CHUNK_ANMF) {
          if (wpi->is_partial == 0) {
            uVar13 = CONCAT44(chunk.data.size._4_4_,(int)chunk.data.size);
            puVar7 = chunk.data.bytes + uVar13;
            if (chunk.data.bytes == (uint8_t *)0x0) {
              puVar7 = (uint8_t *)0x0;
            }
            unknown_chunk_list = &wpi->unknown;
            ChunkInit(&subchunk);
            local_98.bytes = puVar12;
            local_98.size = 0x10;
            if (((0xf < uVar13) &&
                (WVar3 = ChunkAssignData(&subchunk,&local_98,copy_data,chunk.tag),
                WVar3 == WEBP_MUX_OK)) &&
               (WVar3 = ChunkSetHead(&subchunk,(WebPChunk **)wpi), WVar3 == WEBP_MUX_OK)) {
              wpi->is_partial = 1;
              uVar8 = (ulong)((int)subchunk.data.size + 1U & 0xfffffffe);
              puVar12 = puVar12 + uVar8;
              while( true ) {
                uVar13 = uVar13 - uVar8;
                if (puVar12 == puVar7) break;
                ChunkInit(&subchunk);
                WVar3 = ChunkVerifyAndAssign(&subchunk,puVar12,uVar13,uVar13,copy_data);
                if (WVar3 != WEBP_MUX_OK) goto LAB_00140fef;
                WVar5 = ChunkGetIdFromTag(subchunk.tag);
                if (WVar5 == WEBP_CHUNK_UNKNOWN) {
                  if ((wpi->is_partial != 0) ||
                     (WVar3 = ChunkAppend(&subchunk,&unknown_chunk_list), WVar3 != WEBP_MUX_OK))
                  goto LAB_00140fef;
                }
                else {
                  if (WVar5 == WEBP_CHUNK_IMAGE) {
                    if ((*chunk_list != (WebPChunk *)0x0) ||
                       (WVar3 = ChunkSetHead(&subchunk,chunk_list), WVar3 != WEBP_MUX_OK))
                    goto LAB_00140fef;
                    iVar6 = MuxImageFinalize(wpi);
                    iVar10 = 0;
                    if (iVar6 == 0) goto LAB_00140fef;
                  }
                  else {
                    if ((WVar5 != WEBP_CHUNK_ALPHA) || (*chunk_list_00 != (WebPChunk *)0x0))
                    goto LAB_00140fef;
                    WVar3 = ChunkSetHead(&subchunk,chunk_list_00);
                    iVar10 = 1;
                    if (WVar3 != WEBP_MUX_OK) goto LAB_00140fef;
                  }
                  wpi->is_partial = iVar10;
                }
                uVar8 = (ulong)((int)subchunk.data.size + 1U & 0xfffffffe);
                puVar12 = puVar12 + uVar8 + 8;
                uVar8 = uVar8 + 8;
              }
              if (wpi->is_partial == 0) {
                ChunkRelease(&chunk);
                goto LAB_00140d04;
              }
            }
LAB_00140fef:
            ChunkRelease(&subchunk);
          }
          goto LAB_00140fbe;
        }
        if (WVar5 == WEBP_CHUNK_IMAGE) {
          WVar3 = ChunkSetHead(&chunk,chunk_list);
          if ((WVar3 != WEBP_MUX_OK) || (iVar6 = MuxImageFinalize(wpi), iVar6 == 0))
          goto LAB_00140fbe;
          wpi->is_partial = 0;
LAB_00140d04:
          WVar3 = MuxImagePush(wpi,&mux->images);
          if (WVar3 != WEBP_MUX_OK) goto LAB_00140fbe;
          MuxImageInit(wpi);
        }
        else if (WVar5 == WEBP_CHUNK_ALPHA) {
          if ((*chunk_list_00 != (WebPChunk *)0x0) ||
             (WVar3 = ChunkSetHead(&chunk,chunk_list_00), WVar3 != WEBP_MUX_OK)) goto LAB_00140fbe;
          wpi->is_partial = 1;
        }
        else {
          if (wpi->is_partial != 0) goto LAB_00140fbe;
          chunk_list_01 = chunk_list_ends + WVar5;
          if (*chunk_list_01 == (WebPChunk **)0x0) {
            ppWVar9 = MuxGetChunkListFromId(mux,WVar5);
            *chunk_list_01 = ppWVar9;
          }
          WVar3 = ChunkAppend(&chunk,chunk_list_01);
          if (WVar3 != WEBP_MUX_OK) goto LAB_00140fbe;
          if (WVar5 == WEBP_CHUNK_VP8X) {
            if (uVar4 < 10) goto LAB_00140fbe;
            mux->canvas_width =
                 (uint)*(ushort *)(data + 3) + (uint)*(byte *)((long)data + 0xe) * 0x10000 + 1;
            mux->canvas_height =
                 (uint)*(ushort *)((long)data + 0xf) + (uint)*(byte *)((long)data + 0x11) * 0x10000
                 + 1;
          }
        }
        lVar11 = (ulong)uVar4 + 8;
        local_100 = local_100 - lVar11;
        ChunkInit(&chunk);
      }
      if ((wpi->is_partial == 0) && (WVar3 = MuxValidate(mux), WVar3 == WEBP_MUX_OK)) {
        MuxImageDelete(wpi);
        return mux;
      }
      goto LAB_00140fbe;
    }
  }
  wpi = (WebPMuxImage *)0x0;
LAB_00140fbe:
  ChunkRelease(&chunk);
  MuxImageDelete(wpi);
  WebPMuxDelete(mux);
  return (WebPMux *)0x0;
}

Assistant:

WebPMux* WebPMuxCreateInternal(const WebPData* bitstream, int copy_data,
                               int version) {
  size_t riff_size;
  uint32_t tag;
  const uint8_t* end;
  WebPMux* mux = NULL;
  WebPMuxImage* wpi = NULL;
  const uint8_t* data;
  size_t size;
  WebPChunk chunk;
  // Stores the end of the chunk lists so that it is faster to append data to
  // their ends.
  WebPChunk** chunk_list_ends[WEBP_CHUNK_NIL + 1] = { NULL };
  ChunkInit(&chunk);

  if (WEBP_ABI_IS_INCOMPATIBLE(version, WEBP_MUX_ABI_VERSION)) {
    return NULL;  // version mismatch
  }
  if (bitstream == NULL) return NULL;

  data = bitstream->bytes;
  size = bitstream->size;

  if (data == NULL) return NULL;
  if (size < RIFF_HEADER_SIZE + CHUNK_HEADER_SIZE) return NULL;
  if (GetLE32(data + 0) != MKFOURCC('R', 'I', 'F', 'F') ||
      GetLE32(data + CHUNK_HEADER_SIZE) != MKFOURCC('W', 'E', 'B', 'P')) {
    return NULL;
  }

  mux = WebPMuxNew();
  if (mux == NULL) return NULL;

  tag = GetLE32(data + RIFF_HEADER_SIZE);
  if (tag != kChunks[IDX_VP8].tag &&
      tag != kChunks[IDX_VP8L].tag &&
      tag != kChunks[IDX_VP8X].tag) {
    goto Err;  // First chunk should be VP8, VP8L or VP8X.
  }

  riff_size = GetLE32(data + TAG_SIZE);
  if (riff_size > MAX_CHUNK_PAYLOAD) goto Err;

  // Note this padding is historical and differs from demux.c which does not
  // pad the file size.
  riff_size = SizeWithPadding(riff_size);
  // Make sure the whole RIFF header is available.
  if (riff_size < RIFF_HEADER_SIZE) goto Err;
  if (riff_size > size) goto Err;
  // There's no point in reading past the end of the RIFF chunk. Note riff_size
  // includes CHUNK_HEADER_SIZE after SizeWithPadding().
  if (size > riff_size) {
    size = riff_size;
  }

  end = data + size;
  data += RIFF_HEADER_SIZE;
  size -= RIFF_HEADER_SIZE;

  wpi = (WebPMuxImage*)WebPSafeMalloc(1ULL, sizeof(*wpi));
  if (wpi == NULL) goto Err;
  MuxImageInit(wpi);

  // Loop over chunks.
  while (data != end) {
    size_t data_size;
    WebPChunkId id;
    if (ChunkVerifyAndAssign(&chunk, data, size, riff_size,
                             copy_data) != WEBP_MUX_OK) {
      goto Err;
    }
    data_size = ChunkDiskSize(&chunk);
    id = ChunkGetIdFromTag(chunk.tag);
    switch (id) {
      case WEBP_CHUNK_ALPHA:
        if (wpi->alpha != NULL) goto Err;  // Consecutive ALPH chunks.
        if (ChunkSetHead(&chunk, &wpi->alpha) != WEBP_MUX_OK) goto Err;
        wpi->is_partial = 1;  // Waiting for a VP8 chunk.
        break;
      case WEBP_CHUNK_IMAGE:
        if (ChunkSetHead(&chunk, &wpi->img) != WEBP_MUX_OK) goto Err;
        if (!MuxImageFinalize(wpi)) goto Err;
        wpi->is_partial = 0;  // wpi is completely filled.
 PushImage:
        // Add this to mux->images list.
        if (MuxImagePush(wpi, &mux->images) != WEBP_MUX_OK) goto Err;
        MuxImageInit(wpi);  // Reset for reading next image.
        break;
      case WEBP_CHUNK_ANMF:
        if (wpi->is_partial) goto Err;  // Previous wpi is still incomplete.
        if (!MuxImageParse(&chunk, copy_data, wpi)) goto Err;
        ChunkRelease(&chunk);
        goto PushImage;
      default:  // A non-image chunk.
        if (wpi->is_partial) goto Err;  // Encountered a non-image chunk before
                                         // getting all chunks of an image.
        if (chunk_list_ends[id] == NULL) {
          chunk_list_ends[id] =
              MuxGetChunkListFromId(mux, id);  // List to add this chunk.
        }
        if (ChunkAppend(&chunk, &chunk_list_ends[id]) != WEBP_MUX_OK) goto Err;
        if (id == WEBP_CHUNK_VP8X) {  // grab global specs
          if (data_size < CHUNK_HEADER_SIZE + VP8X_CHUNK_SIZE) goto Err;
          mux->canvas_width = GetLE24(data + 12) + 1;
          mux->canvas_height = GetLE24(data + 15) + 1;
        }
        break;
    }
    data += data_size;
    size -= data_size;
    ChunkInit(&chunk);
  }

  // Incomplete image.
  if (wpi->is_partial) goto Err;

  // Validate mux if complete.
  if (MuxValidate(mux) != WEBP_MUX_OK) goto Err;

  MuxImageDelete(wpi);
  return mux;  // All OK;

 Err:  // Something bad happened.
  ChunkRelease(&chunk);
  MuxImageDelete(wpi);
  WebPMuxDelete(mux);
  return NULL;
}